

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_set.h
# Opt level: O3

vector<long,_std::allocator<long>_> *
vset::set_union<long>
          (vector<long,_std::allocator<long>_> *__return_storage_ptr__,
          vector<long,_std::allocator<long>_> *v1,vector<long,_std::allocator<long>_> *v2)

{
  BPlusTree<long> **ppBVar1;
  pointer plVar2;
  iterator __position;
  pointer plVar3;
  long e;
  BPlusTree<long> tree;
  Iterator local_88;
  long local_78;
  BPlusTree<long> local_70;
  
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  BPlusTree<long>::BPlusTree(&local_70,false);
  plVar3 = (v1->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  plVar2 = (v1->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if (plVar3 != plVar2) {
    do {
      local_88.node_ptr = (BPlusTree<long> *)*plVar3;
      BPlusTree<long>::insert(&local_70,(long *)&local_88);
      plVar3 = plVar3 + 1;
    } while (plVar3 != plVar2);
  }
  plVar3 = (v2->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  plVar2 = (v2->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if (plVar3 != plVar2) {
    do {
      local_88.node_ptr = (BPlusTree<long> *)*plVar3;
      BPlusTree<long>::insert(&local_70,(long *)&local_88);
      plVar3 = plVar3 + 1;
    } while (plVar3 != plVar2);
  }
  local_88 = BPlusTree<long>::begin(&local_70);
  if (local_88.node_ptr != (BPlusTree<long> *)0x0) {
    do {
      while( true ) {
        local_78 = BPlusTree<long>::Iterator::operator*(&local_88);
        __position._M_current =
             (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                    (__return_storage_ptr__,__position,&local_78);
        }
        else {
          *__position._M_current = local_78;
          (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        if ((local_88.node_ptr)->data_size - 1 <= local_88.offset) break;
        local_88.offset = local_88.offset + 1;
      }
      ppBVar1 = &(local_88.node_ptr)->next;
      local_88.offset = 0;
      local_88.node_ptr = *ppBVar1;
    } while (*ppBVar1 != (BPlusTree<long> *)0x0);
  }
  BPlusTree<long>::~BPlusTree(&local_70);
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> set_union(const std::vector<T>& v1, const std::vector<T>& v2) {
    std::vector<T> result;
    BPlusTree<T> tree;
    for (T e : v1)
        tree.insert(e);

    for (T e : v2)
        tree.insert(e);

    for (auto it = tree.begin(); it != nullptr; ++it) {
        result.push_back(*it);
    }
    return result;
}